

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O0

GCtab * lj_lib_checktabornil(lua_State *L,int narg)

{
  long lVar1;
  lua_State *L_00;
  int in_ESI;
  long in_RDI;
  TValue *o;
  ErrMsg in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  GCtab *local_8;
  
  lVar1 = *(long *)(in_RDI + 0x10) + (long)in_ESI * 8;
  L_00 = (lua_State *)(lVar1 + -8);
  if (L_00 < *(lua_State **)(in_RDI + 0x18)) {
    if (*(int *)(lVar1 + -4) == -0xc) {
      local_8 = (GCtab *)(ulong)(L_00->nextgc).gcptr32;
    }
    else {
      if (*(int *)(lVar1 + -4) != -1) goto LAB_001857ce;
      local_8 = (GCtab *)0x0;
    }
    return local_8;
  }
LAB_001857ce:
  lj_err_arg(L_00,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
}

Assistant:

GCtab *lj_lib_checktabornil(lua_State *L, int narg)
{
  TValue *o = L->base + narg-1;
  if (o < L->top) {
    if (tvistab(o))
      return tabV(o);
    else if (tvisnil(o))
      return NULL;
  }
  lj_err_arg(L, narg, LJ_ERR_NOTABN);
  return NULL;  /* unreachable */
}